

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IterativeAlgorithm.cpp
# Opt level: O0

void __thiscall
van_kampen::IterativeAlgorithm::generate
          (IterativeAlgorithm *this,
          vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
          *words_)

{
  iterator __first;
  iterator __last;
  unsigned_long *puVar1;
  size_type __n;
  reference __x;
  _Bit_pointer puVar2;
  ostream *poVar3;
  size_t sVar4;
  undefined1 local_160 [8];
  anon_class_56_7_b2ce0729 iterateOverWordsOnce;
  reference local_110;
  long local_100;
  size_t increase;
  string local_f0;
  undefined1 local_d0 [8];
  ProcessLogger logger;
  undefined1 local_80 [6];
  bool isAdditionForced;
  vector<bool,_std::allocator<bool>_> isAdded;
  size_t totalIterations;
  undefined1 local_30 [8];
  vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
  words;
  vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
  *words__local;
  IterativeAlgorithm *this_local;
  
  words.
  super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)words_;
  std::
  vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
  ::vector((vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
            *)local_30,words_);
  __first = std::
            vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
            ::begin((vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
                     *)local_30);
  __last = std::
           vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
           ::end((vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
                  *)local_30);
  std::
  reverse<__gnu_cxx::__normal_iterator<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>*,std::vector<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>,std::allocator<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>>>>>
            ((__normal_iterator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_*,_std::vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>_>
              )__first._M_current,
             (__normal_iterator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_*,_std::vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>_>
              )__last._M_current);
  isAdded.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage =
       (_Bit_pointer)
       std::
       vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
       ::size((vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
               *)local_30);
  if (this->cellsLimit != 0) {
    puVar1 = std::min<unsigned_long>
                       ((unsigned_long *)
                        &isAdded.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_end_of_storage,&this->cellsLimit);
    isAdded.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)*puVar1;
  }
  __n = std::
        vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
        ::size((vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
                *)local_30);
  std::allocator<bool>::allocator((allocator<bool> *)&logger.field_0x47);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_80,__n,
             (allocator_type *)&logger.field_0x47);
  std::allocator<bool>::~allocator((allocator<bool> *)&logger.field_0x47);
  puVar2 = isAdded.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_end_of_storage;
  logger._70_1_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"Relations used",(allocator<char> *)((long)&increase + 7));
  ProcessLogger::ProcessLogger
            ((ProcessLogger *)local_d0,(size_t)puVar2,(ostream *)&std::clog,&local_f0,
             (bool)(this->quiet & 1));
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&increase + 7));
  local_100 = 0;
  local_110 = std::vector<bool,_std::allocator<bool>_>::front
                        ((vector<bool,_std::allocator<bool>_> *)local_80);
  std::_Bit_reference::operator=(&local_110,true);
  __x = std::
        vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
        ::front((vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
                 *)local_30);
  std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>::vector
            ((vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_> *)
             &iterateOverWordsOnce.increase,__x);
  Diagramm::bindWord(&this->diagramm_,
                     (vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_> *)
                     &iterateOverWordsOnce.increase,false,true);
  std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>::~vector
            ((vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_> *)
             &iterateOverWordsOnce.increase);
  ProcessLogger::iterate((ProcessLogger *)local_d0);
  local_160 = (undefined1  [8])local_30;
  iterateOverWordsOnce.words =
       (vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
        *)local_d0;
  iterateOverWordsOnce.logger =
       (ProcessLogger *)
       &isAdded.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage;
  iterateOverWordsOnce.totalIterations = (size_t *)local_80;
  iterateOverWordsOnce.this = (IterativeAlgorithm *)&logger.field_0x46;
  iterateOverWordsOnce.isAdditionForced = (bool *)&local_100;
  local_100 = 1;
  iterateOverWordsOnce.isAdded = (vector<bool,_std::allocator<bool>_> *)this;
  while (local_100 != 0) {
    local_100 = 0;
    generate::anon_class_56_7_b2ce0729::operator()((anon_class_56_7_b2ce0729 *)local_160);
  }
  logger._70_1_ = 1;
  local_100 = 1;
  while (local_100 != 0) {
    local_100 = 0;
    generate::anon_class_56_7_b2ce0729::operator()((anon_class_56_7_b2ce0729 *)local_160);
  }
  puVar2 = (_Bit_pointer)ProcessLogger::getIteration((ProcessLogger *)local_d0);
  if ((puVar2 < isAdded.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_end_of_storage) && ((this->quiet & 1U) == 0)) {
    poVar3 = std::operator<<((ostream *)&std::clog,"can not bind ");
    puVar2 = isAdded.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_end_of_storage;
    sVar4 = ProcessLogger::getIteration((ProcessLogger *)local_d0);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(long)puVar2 - sVar4);
    std::operator<<(poVar3," relations, finishing");
  }
  ProcessLogger::~ProcessLogger((ProcessLogger *)local_d0);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_80)
  ;
  std::
  vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
  ::~vector((vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
             *)local_30);
  return;
}

Assistant:

void IterativeAlgorithm::generate(const std::vector<std::vector<GroupElement>> &words_)
{
    auto words = words_;
    std::reverse(words.begin(), words.end());
    std::size_t totalIterations = words.size();
    if (cellsLimit)
    {
        totalIterations = std::min(totalIterations, cellsLimit);
    }
    std::vector<bool> isAdded(words.size());
    bool isAdditionForced = false;
    ProcessLogger logger(totalIterations, std::clog, "Relations used", quiet);
    std::size_t increase = 0;
    isAdded.front() = true;
    diagramm_.bindWord(words.front(), false, true);
    logger.iterate();
    auto iterateOverWordsOnce = [&]() {
        for (std::size_t i = 0; i < words.size(); ++i)
        {
            if (logger.getIteration() >= totalIterations)
            {
                break;
            }
            if (isAdded[i])
                continue;
            if (diagramm_.bindWord(words[i], isAdditionForced, false))
            {
                isAdded[i] = true;
                increase += 1;
                if (logger.iterate() >= totalIterations)
                {
                    break;
                }
            }
        }
    };
    increase = 1;
    while (increase)
    {
        increase = 0;
        iterateOverWordsOnce();
    }
    isAdditionForced = true;
    increase = 1;
    while (increase)
    {
        increase = 0;
        iterateOverWordsOnce();
    }
    if (logger.getIteration() < totalIterations && !quiet)
    {
        std::clog << "can not bind " << totalIterations - logger.getIteration() << " relations, finishing";
    }
}